

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

bool __thiscall
flatbuffers::rust::RustGenerator::TableBuilderArgsNeedsLifetime
          (RustGenerator *this,StructDef *struct_def)

{
  FullType FVar1;
  uint uVar2;
  pointer ppFVar3;
  bool bVar4;
  
  if (struct_def->fixed == true) {
    __assert_fail("!struct_def.fixed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x212,
                  "bool flatbuffers::rust::RustGenerator::TableBuilderArgsNeedsLifetime(const StructDef &) const"
                 );
  }
  ppFVar3 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar4 = ppFVar3 !=
          (struct_def->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (bVar4) {
    do {
      uVar2 = 0;
      if ((*ppFVar3)->deprecated == false) {
        FVar1 = anon_unknown_26::GetFullType(&((*ppFVar3)->value).type);
        uVar2 = 1;
        if (FVar1 < ftString) {
          uVar2 = *(uint *)(&DAT_00382130 + (ulong)FVar1 * 4);
        }
      }
      if ((uVar2 & 0xfffffffb) != 0) {
        return bVar4;
      }
      ppFVar3 = ppFVar3 + 1;
      bVar4 = ppFVar3 !=
              (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

bool TableBuilderArgsNeedsLifetime(const StructDef &struct_def) const {
    FLATBUFFERS_ASSERT(!struct_def.fixed);

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) { continue; }

      if (TableBuilderTypeNeedsLifetime(field.value.type)) { return true; }
    }

    return false;
  }